

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_action.cpp
# Opt level: O1

bool __thiscall
cppnet::EpollEventActions::MakeEpollEvent
          (EpollEventActions *this,Event *event,epoll_event **ep_event)

{
  int iVar1;
  undefined8 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar3;
  long lVar4;
  SingletonLogger *this_01;
  epoll_event *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  element_type *peVar6;
  bool bVar7;
  
  this_02 = (event->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar3 = this_02->_M_use_count;
    do {
      if (iVar3 == 0) {
        this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_02->_M_use_count;
      bVar7 = iVar3 == iVar1;
      if (bVar7) {
        this_02->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar7);
  }
  if (this_02 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar7 = true;
  }
  else {
    bVar7 = this_02->_M_use_count == 0;
  }
  if (bVar7) {
    peVar6 = (element_type *)0x0;
  }
  else {
    peVar6 = (event->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar6 == (element_type *)0x0) {
    this_01 = Singleton<cppnet::SingletonLogger>::Instance();
    SingletonLogger::Warn
              (this_01,
               "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
               ,0x187,"socket is already destroyed! event %s","AddSendEvent");
  }
  else {
    lVar4 = __dynamic_cast(peVar6,&Socket::typeinfo,&RWSocket::typeinfo,0);
    if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_02->_M_use_count = this_02->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_02->_M_use_count = this_02->_M_use_count + 1;
      }
    }
    puVar2 = *(undefined8 **)(lVar4 + 0xc0);
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar4 + 200);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    peVar5 = (epoll_event *)(**(code **)(*(long *)*puVar2 + 0x18))((long *)*puVar2,0xc);
    if (peVar5 == (epoll_event *)0x0) {
      peVar5 = (epoll_event *)0x0;
    }
    else {
      *(undefined4 *)((long)&peVar5->data + 4) = 0;
      *(undefined8 *)peVar5 = 0;
    }
    *ep_event = peVar5;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    peVar5 = *ep_event;
    *(undefined4 *)((long)&peVar5->data + 4) = 0;
    *(undefined8 *)peVar5 = 0;
    event->_data = *ep_event;
    ((*ep_event)->data).ptr = event;
    if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
    }
  }
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  return peVar6 != (element_type *)0x0;
}

Assistant:

bool EpollEventActions::MakeEpollEvent(Event* event, epoll_event* &ep_event) {
    auto sock = event->GetSocket();
    if (!sock) {
        LOG_WARN("socket is already destroyed! event %s", "AddSendEvent");
        return false;
    }

    auto rw_sock = std::dynamic_pointer_cast<RWSocket>(sock);
    ep_event = rw_sock->GetAlloter()->PoolNew<epoll_event>();
    memset(ep_event, 0, sizeof(epoll_event));
    event->SetData(ep_event);
    ep_event->data.ptr = (void*)event;

    return true;
}